

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

bool __thiscall LinearScan::SkipNumberedInstr(LinearScan *this,Instr *instr)

{
  code *pcVar1;
  IRKind IVar2;
  bool bVar3;
  uint32 uVar4;
  uint32 uVar5;
  LabelInstr *pLVar6;
  undefined4 *puVar7;
  bool local_29;
  Instr *instr_local;
  LinearScan *this_local;
  
  IVar2 = IR::Instr::GetKind(instr);
  local_29 = true;
  if (IVar2 != InstrKindLabel) {
    local_29 = IR::Instr::IsProfiledLabelInstr(instr);
  }
  if (local_29 != false) {
    pLVar6 = IR::Instr::AsLabelInstr(instr);
    if ((pLVar6->field_0x78 & 1) == 0) {
      return true;
    }
    uVar4 = IR::Instr::GetNumber(instr);
    uVar5 = IR::Instr::GetNumber(instr->m_next);
    if (uVar4 != uVar5) {
      uVar4 = IR::Instr::GetNumber(instr);
      uVar5 = IR::Instr::GetNumber(instr->m_prev);
      if (uVar4 != uVar5) {
        return false;
      }
      if (instr->m_prev->m_opcode == Nop) {
        return false;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x92b,
                       "(instr->GetNumber() != instr->m_next->GetNumber() && (instr->GetNumber() != instr->m_prev->GetNumber() || instr->m_prev->m_opcode == Js::OpCode::Nop))"
                       ,
                       "instr->GetNumber() != instr->m_next->GetNumber() && (instr->GetNumber() != instr->m_prev->GetNumber() || instr->m_prev->m_opcode == Js::OpCode::Nop)"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return false;
}

Assistant:

bool
LinearScan::SkipNumberedInstr(IR::Instr *instr)
{
    if (instr->IsLabelInstr())
    {
        if (instr->AsLabelInstr()->m_isLoopTop)
        {
            Assert(instr->GetNumber() != instr->m_next->GetNumber()
                && (instr->GetNumber() != instr->m_prev->GetNumber() || instr->m_prev->m_opcode == Js::OpCode::Nop));
        }
        else
        {
            return true;
        }
    }
    return false;
}